

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O1

MessageType __thiscall
cmMakefile::ExpandVariablesInStringNew
          (cmMakefile *this,string *errorstr,string *source,bool escapeQuotes,bool noEscapes,
          bool atOnly,char *filename,long line,bool removeEmpty,bool replaceAt)

{
  byte bVar1;
  char cVar2;
  ulong uVar3;
  cmake *this_00;
  cmState **ppcVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  int iVar9;
  char *pcVar10;
  Snapshot *extraout_RAX;
  undefined4 extraout_var_00;
  iterator iVar11;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined7 extraout_var;
  long *plVar12;
  undefined8 uVar13;
  Snapshot *extraout_RAX_00;
  Snapshot *extraout_RAX_01;
  Snapshot *pSVar14;
  undefined8 *puVar15;
  Snapshot *extraout_RAX_02;
  Snapshot *pSVar16;
  Snapshot *extraout_RAX_03;
  size_t sVar17;
  ostream *poVar18;
  undefined7 in_register_00000009;
  ulong *puVar19;
  undefined7 in_register_00000081;
  undefined3 in_register_00000089;
  Snapshot *pSVar20;
  Snapshot *pSVar21;
  cmListFileContext lfc;
  string result;
  vector<t_lookup,_std::allocator<t_lookup>_> openstack;
  t_lookup lookup;
  ostringstream ostr;
  cmOutputConverter converter;
  MessageType local_3ac;
  undefined1 local_3a0 [35];
  allocator local_37d;
  allocator local_37c;
  allocator local_37b;
  allocator local_37a;
  allocator local_379;
  undefined1 local_378 [32];
  _Alloc_hider local_358;
  size_type local_350;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_348;
  long local_338;
  Snapshot *local_330;
  undefined1 *local_328;
  Snapshot *local_320;
  undefined1 local_318;
  undefined7 uStack_317;
  Snapshot *local_308;
  iterator iStack_300;
  t_lookup *local_2f8;
  undefined1 *local_2e8;
  Snapshot *pSStack_2e0;
  undefined1 local_2d8;
  undefined7 uStack_2d7;
  undefined4 local_2c4;
  long local_2c0;
  undefined4 local_2b8;
  undefined4 local_2b4;
  Snapshot *local_2b0;
  string *local_2a8;
  Snapshot *local_2a0;
  string local_298;
  RegularExpression *local_278;
  cmState *local_270;
  string local_268;
  string local_248;
  string local_228;
  string local_208;
  string local_1e8;
  undefined1 local_1c8 [16];
  Snapshot local_1b8 [4];
  ios_base local_158 [264];
  cmOutputConverter local_50;
  
  local_2b8 = CONCAT31(in_register_00000089,atOnly);
  local_2b4 = (undefined4)CONCAT71(in_register_00000081,noEscapes);
  local_2c4 = (undefined4)CONCAT71(in_register_00000009,escapeQuotes);
  pSVar20 = (Snapshot *)(source->_M_dataplus)._M_p;
  local_328 = &local_318;
  local_320 = (Snapshot *)0x0;
  local_318 = 0;
  local_2a8 = source;
  std::__cxx11::string::reserve((ulong)&local_328);
  local_2c0 = line;
  local_308 = (Snapshot *)0x0;
  iStack_300._M_current = (t_lookup *)0x0;
  local_2f8 = (t_lookup *)0x0;
  local_270 = this->GlobalGenerator->CMakeInstance->State;
  local_278 = &this->cmNamedCurly;
  iVar11._M_current = (t_lookup *)&this->StateSnapshot;
  local_3ac = LOG;
  local_2a0 = (Snapshot *)0x0;
  local_330 = (Snapshot *)0x0;
  pSVar14 = pSVar20;
  local_2b0 = (Snapshot *)iVar11._M_current;
  do {
    bVar1 = *(byte *)&pSVar20->State;
    pSVar16 = pSVar14;
    if (bVar1 < 0x40) {
      if (bVar1 == 0) {
        iVar11._M_current = (t_lookup *)CONCAT71((int7)((ulong)iVar11._M_current >> 8),1);
        local_2a0 = (Snapshot *)iVar11._M_current;
      }
      else if (bVar1 == 10) {
        local_2c0 = local_2c0 + 1;
      }
      else {
        if (bVar1 != 0x24) goto LAB_0039d3af;
        if ((char)local_2b8 != '\0') goto LAB_0039d1bc;
        uVar3 = (ulong)local_2e8 >> 0x20;
        local_2e8 = (undefined1 *)(uVar3 << 0x20);
        pSStack_2e0 = (Snapshot *)0x0;
        pSVar16 = (Snapshot *)((long)&pSVar20->State + 1);
        cVar2 = *(char *)((long)&pSVar20->State + 1);
        iVar11._M_current = (t_lookup *)0x0;
        if (cVar2 == '\0') {
          iVar11._M_current =
               (t_lookup *)std::__cxx11::string::append((char *)&local_328,(ulong)pSVar14);
          pSVar21 = (Snapshot *)0x0;
        }
        else if (cVar2 == '<') {
LAB_0039dbc4:
          pSVar21 = (Snapshot *)0x0;
          pSVar16 = pSVar14;
        }
        else if (cVar2 == '{') {
          pSVar21 = (Snapshot *)((long)&pSVar20->State + 2);
          local_2e8 = (undefined1 *)(uVar3 << 0x20);
          pSVar16 = pSVar14;
        }
        else {
          iVar8 = strncmp((char *)pSVar16,"ENV{",4);
          iVar11._M_current = (t_lookup *)CONCAT44(extraout_var_01,iVar8);
          if (iVar8 == 0) {
            pSVar21 = (Snapshot *)((long)&pSVar20->State + 5);
            local_2e8 = (undefined1 *)CONCAT44(local_2e8._4_4_,1);
            pSVar16 = pSVar14;
          }
          else {
            iVar8 = strncmp((char *)pSVar16,"CACHE{",6);
            iVar11._M_current = (t_lookup *)CONCAT44(extraout_var_02,iVar8);
            if (iVar8 != 0) {
              bVar5 = cmsys::RegularExpression::find(local_278,(char *)pSVar16);
              iVar11._M_current = (t_lookup *)CONCAT71(extraout_var,bVar5);
              if (bVar5) {
                local_3a0._0_8_ = local_3a0 + 0x10;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_3a0,pSVar16,
                           (char *)(((long)(this->cmNamedCurly).endp[0] -
                                    (long)(this->cmNamedCurly).searchstring) + (long)pSVar16));
                plVar12 = (long *)std::__cxx11::string::replace
                                            ((ulong)local_3a0,0,(char *)0x0,0x4e3374);
                local_378._0_8_ = local_378 + 0x10;
                puVar19 = (ulong *)(plVar12 + 2);
                if ((ulong *)*plVar12 == puVar19) {
                  local_378._16_8_ = *puVar19;
                  local_378._24_8_ = plVar12[3];
                }
                else {
                  local_378._16_8_ = *puVar19;
                  local_378._0_8_ = (ulong *)*plVar12;
                }
                local_378._8_8_ = plVar12[1];
                *plVar12 = (long)puVar19;
                plVar12[1] = 0;
                *(undefined1 *)(plVar12 + 2) = 0;
                puVar15 = (undefined8 *)std::__cxx11::string::append(local_378);
                pSVar16 = (Snapshot *)(puVar15 + 2);
                if ((Snapshot *)*puVar15 == pSVar16) {
                  local_1b8[0].State = pSVar16->State;
                  local_1b8[0].Position.Tree = (cmLinkedTree<cmState::SnapshotDataType> *)puVar15[3]
                  ;
                  local_1c8._0_8_ = local_1b8;
                }
                else {
                  local_1b8[0].State = pSVar16->State;
                  local_1c8._0_8_ = (Snapshot *)*puVar15;
                }
                local_1c8._8_8_ = puVar15[1];
                *puVar15 = pSVar16;
                puVar15[1] = 0;
                *(undefined1 *)(puVar15 + 2) = 0;
                std::__cxx11::string::operator=((string *)errorstr,(string *)local_1c8);
                if ((Snapshot *)local_1c8._0_8_ != local_1b8) {
                  operator_delete((void *)local_1c8._0_8_,(ulong)((long)local_1b8[0].State + 1));
                }
                if ((undefined1 *)local_378._0_8_ != local_378 + 0x10) {
                  operator_delete((void *)local_378._0_8_,local_378._16_8_ + 1);
                }
                pSVar16 = (Snapshot *)(local_3a0 + 0x10);
                if ((Snapshot *)local_3a0._0_8_ != pSVar16) {
                  operator_delete((void *)local_3a0._0_8_,local_3a0._16_8_ + 1);
                  pSVar16 = extraout_RAX_02;
                }
                iVar11._M_current = (t_lookup *)CONCAT71((int7)((ulong)pSVar16 >> 8),1);
                local_3ac = FATAL_ERROR;
                local_330 = (Snapshot *)iVar11._M_current;
              }
              goto LAB_0039dbc4;
            }
            pSVar21 = (Snapshot *)((long)&pSVar20->State + 7);
            local_2e8 = (undefined1 *)CONCAT44(local_2e8._4_4_,2);
            pSVar16 = pSVar14;
          }
        }
        if (pSVar21 != (Snapshot *)0x0) {
          std::__cxx11::string::append((char *)&local_328,(ulong)pSVar16);
          pSVar20 = (Snapshot *)((long)&pSVar21[-1].Position.Position + 7);
          pSStack_2e0 = local_320;
          pSVar16 = pSVar21;
          if (iStack_300._M_current == local_2f8) {
            std::vector<t_lookup,std::allocator<t_lookup>>::_M_realloc_insert<t_lookup_const&>
                      ((vector<t_lookup,std::allocator<t_lookup>> *)&local_308,iStack_300,
                       (t_lookup *)&local_2e8);
            iVar11._M_current = (t_lookup *)extraout_RAX_03;
          }
          else {
            *(undefined1 **)iStack_300._M_current = local_2e8;
            (iStack_300._M_current)->loc = (size_t)local_320;
            iStack_300._M_current = iStack_300._M_current + 1;
            iVar11._M_current = (t_lookup *)local_320;
          }
        }
      }
    }
    else if (bVar1 == 0x40) {
      if (replaceAt) {
        pSVar16 = (Snapshot *)((long)&pSVar20->State + 1);
        pSVar21 = (Snapshot *)strchr((char *)pSVar16,0x40);
        iVar11._M_current =
             (t_lookup *)CONCAT71((int7)((ulong)pSVar21 >> 8),pSVar21 == (Snapshot *)0x0);
        bVar5 = true;
        if (pSVar21 != pSVar16 && pSVar21 != (Snapshot *)0x0) {
          sVar17 = strspn((char *)pSVar16,
                          "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789/_.+-");
          iVar11._M_current = (t_lookup *)((long)&pSVar16->State + sVar17);
          if (pSVar21 == (Snapshot *)iVar11._M_current) {
            local_1c8._0_8_ = local_1b8;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_1c8,pSVar16,
                       (char *)((long)&pSVar16->State + ~(ulong)pSVar20) + (long)pSVar21);
            pcVar10 = GetDefinition(this,(string *)local_1c8);
            if (pcVar10 == (char *)0x0) {
              pcVar10 = "";
            }
            std::__cxx11::string::string((string *)local_378,pcVar10,(allocator *)local_3a0);
            if ((char)local_2c4 != '\0') {
              cmSystemTools::EscapeQuotes((string *)local_3a0,(string *)local_378);
              std::__cxx11::string::operator=((string *)local_378,(string *)local_3a0);
              if ((Snapshot *)local_3a0._0_8_ != (Snapshot *)(local_3a0 + 0x10)) {
                operator_delete((void *)local_3a0._0_8_,local_3a0._16_8_ + 1);
              }
            }
            std::__cxx11::string::append((char *)&local_328,(ulong)pSVar14);
            std::__cxx11::string::_M_append((char *)&local_328,local_378._0_8_);
            if ((undefined1 *)local_378._0_8_ != local_378 + 0x10) {
              operator_delete((void *)local_378._0_8_,local_378._16_8_ + 1);
            }
            iVar11._M_current = (t_lookup *)local_1b8;
            if ((t_lookup *)local_1c8._0_8_ != iVar11._M_current) {
              operator_delete((void *)local_1c8._0_8_,(ulong)((long)local_1b8[0].State + 1));
              iVar11._M_current = (t_lookup *)extraout_RAX;
            }
            pSVar14 = (Snapshot *)((long)&pSVar21->State + 1);
            bVar5 = false;
            pSVar20 = pSVar21;
          }
        }
        pSVar16 = pSVar14;
        if (!bVar5) goto LAB_0039dc3b;
      }
LAB_0039d3af:
      iVar11._M_current = (t_lookup *)local_308;
      pSVar16 = pSVar14;
      if (local_308 != (Snapshot *)iStack_300._M_current) {
        iVar8 = isalnum((int)(char)bVar1);
        iVar11._M_current = (t_lookup *)CONCAT44(extraout_var_00,iVar8);
        if ((iVar8 == 0) &&
           ((iVar11._M_current = (t_lookup *)(ulong)(bVar1 - 0x2b), 0x34 < bVar1 - 0x2b ||
            ((0x1000000000001dU >> ((ulong)iVar11._M_current & 0x3f) & 1) == 0)))) {
          std::__cxx11::string::append((char *)errorstr);
          std::__cxx11::string::push_back((char)errorstr);
          std::__cxx11::string::append((char *)&local_328,(ulong)pSVar14);
          std::__cxx11::string::substr((ulong)local_3a0,(ulong)&local_328);
          plVar12 = (long *)std::__cxx11::string::replace((ulong)local_3a0,0,(char *)0x0,0x4e3449);
          local_378._0_8_ = local_378 + 0x10;
          puVar19 = (ulong *)(plVar12 + 2);
          if ((ulong *)*plVar12 == puVar19) {
            local_378._16_8_ = *puVar19;
            local_378._24_8_ = plVar12[3];
          }
          else {
            local_378._16_8_ = *puVar19;
            local_378._0_8_ = (ulong *)*plVar12;
          }
          local_378._8_8_ = plVar12[1];
          *plVar12 = (long)puVar19;
          plVar12[1] = 0;
          *(undefined1 *)(plVar12 + 2) = 0;
          puVar15 = (undefined8 *)std::__cxx11::string::append(local_378);
          local_1c8._0_8_ = local_1b8;
          pSVar14 = (Snapshot *)(puVar15 + 2);
          if ((Snapshot *)*puVar15 == pSVar14) {
            local_1b8[0].State = pSVar14->State;
            local_1b8[0].Position.Tree = (cmLinkedTree<cmState::SnapshotDataType> *)puVar15[3];
          }
          else {
            local_1b8[0].State = pSVar14->State;
            local_1c8._0_8_ = (Snapshot *)*puVar15;
          }
          local_1c8._8_8_ = puVar15[1];
          *puVar15 = pSVar14;
          puVar15[1] = 0;
          *(undefined1 *)(puVar15 + 2) = 0;
          std::__cxx11::string::_M_append((char *)errorstr,local_1c8._0_8_);
          if ((Snapshot *)local_1c8._0_8_ != local_1b8) {
            operator_delete((void *)local_1c8._0_8_,(ulong)((long)local_1b8[0].State + 1));
          }
          if ((undefined1 *)local_378._0_8_ != local_378 + 0x10) {
            operator_delete((void *)local_378._0_8_,local_378._16_8_ + 1);
          }
          pSVar14 = (Snapshot *)(local_3a0 + 0x10);
          if ((Snapshot *)local_3a0._0_8_ != pSVar14) {
            operator_delete((void *)local_3a0._0_8_,local_3a0._16_8_ + 1);
            pSVar14 = extraout_RAX_01;
          }
          iVar11._M_current = (t_lookup *)CONCAT71((int7)((ulong)pSVar14 >> 8),1);
          local_3ac = FATAL_ERROR;
          local_330 = (Snapshot *)iVar11._M_current;
        }
      }
    }
    else if (bVar1 == 0x5c) {
LAB_0039d1bc:
      if ((char)local_2b4 != '\0') goto LAB_0039dc3b;
      pSVar21 = (Snapshot *)((long)&pSVar20->State + 1);
      bVar1 = *(byte *)((long)&pSVar20->State + 1);
      if (bVar1 < 0x72) {
        if (bVar1 == 0x3b) {
          iVar11._M_current = (t_lookup *)local_308;
          if (local_308 == (Snapshot *)iStack_300._M_current) goto LAB_0039d6f7;
        }
        else if (bVar1 == 0x6e) {
          std::__cxx11::string::append((char *)&local_328,(ulong)pSVar14);
          iVar11._M_current = (t_lookup *)std::__cxx11::string::append((char *)&local_328);
          goto LAB_0039d5c1;
        }
LAB_0039d55d:
        iVar8 = isalnum((int)(char)bVar1);
        if ((bVar1 == 0) || (iVar8 != 0)) {
          uVar13 = std::__cxx11::string::append((char *)errorstr);
          if (bVar1 != 0) {
            uVar13 = std::__cxx11::string::push_back((char)errorstr);
          }
          local_330 = (Snapshot *)CONCAT71((int7)((ulong)uVar13 >> 8),1);
          iVar11._M_current = (t_lookup *)std::__cxx11::string::append((char *)errorstr);
        }
        else {
          iVar11._M_current =
               (t_lookup *)std::__cxx11::string::append((char *)&local_328,(ulong)pSVar14);
          pSVar14 = pSVar21;
        }
      }
      else {
        if (bVar1 == 0x72) {
          std::__cxx11::string::append((char *)&local_328,(ulong)pSVar14);
          iVar11._M_current = (t_lookup *)std::__cxx11::string::append((char *)&local_328);
        }
        else {
          if (bVar1 != 0x74) goto LAB_0039d55d;
          std::__cxx11::string::append((char *)&local_328,(ulong)pSVar14);
          iVar11._M_current = (t_lookup *)std::__cxx11::string::append((char *)&local_328);
        }
LAB_0039d5c1:
        pSVar14 = (Snapshot *)((long)&pSVar20->State + 2);
      }
LAB_0039d6f7:
      pSVar16 = pSVar14;
      if (*(char *)&pSVar14->State != '\0') {
        pSVar20 = pSVar21;
      }
    }
    else {
      if (bVar1 != 0x7d) goto LAB_0039d3af;
      iVar11._M_current = iStack_300._M_current;
      if (local_308 == (Snapshot *)iStack_300._M_current) goto LAB_0039dc3b;
      iVar8 = *(int *)&(((Snapshot *)((long)iStack_300._M_current + -0x18))->Position).Tree;
      uVar3 = (((Snapshot *)((long)iStack_300._M_current + -0x18))->Position).Position;
      iStack_300._M_current =
           (t_lookup *)&((Snapshot *)((long)iStack_300._M_current + -0x18))->Position;
      std::__cxx11::string::append((char *)&local_328,(ulong)pSVar14);
      std::__cxx11::string::substr((ulong)local_3a0,(ulong)&local_328);
      local_2e8 = &local_2d8;
      pSStack_2e0 = (Snapshot *)0x0;
      local_2d8 = 0;
      if ((ExpandVariablesInStringNew(std::__cxx11::string&,std::__cxx11::string&,bool,bool,bool,char_const*,long,bool,bool)
           ::lineVar_abi_cxx11_ == '\0') &&
         (iVar9 = __cxa_guard_acquire(&ExpandVariablesInStringNew(std::__cxx11::string&,std::__cxx11::string&,bool,bool,bool,char_const*,long,bool,bool)
                                       ::lineVar_abi_cxx11_), iVar9 != 0)) {
        ExpandVariablesInStringNew(std::__cxx11::string&,std::__cxx11::string&,bool,bool,bool,char_const*,long,bool,bool)
        ::lineVar_abi_cxx11_._M_dataplus._M_p =
             (pointer)&ExpandVariablesInStringNew(std::__cxx11::string&,std::__cxx11::string&,bool,bool,bool,char_const*,long,bool,bool)
                       ::lineVar_abi_cxx11_.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)
                   &ExpandVariablesInStringNew(std::__cxx11::string&,std::__cxx11::string&,bool,bool,bool,char_const*,long,bool,bool)
                    ::lineVar_abi_cxx11_,"CMAKE_CURRENT_LIST_LINE","");
        __cxa_atexit(std::__cxx11::string::~string,
                     &ExpandVariablesInStringNew(std::__cxx11::string&,std::__cxx11::string&,bool,bool,bool,char_const*,long,bool,bool)
                      ::lineVar_abi_cxx11_,&__dso_handle);
        __cxa_guard_release(&ExpandVariablesInStringNew(std::__cxx11::string&,std::__cxx11::string&,bool,bool,bool,char_const*,long,bool,bool)
                             ::lineVar_abi_cxx11_);
      }
      if (iVar8 == 0) {
        if (((filename == (char *)0x0) ||
            (local_3a0._8_8_ !=
             ExpandVariablesInStringNew(std::__cxx11::string&,std::__cxx11::string&,bool,bool,bool,char_const*,long,bool,bool)
             ::lineVar_abi_cxx11_._M_string_length)) ||
           ((local_3a0._8_8_ != 0 &&
            (iVar8 = bcmp((void *)local_3a0._0_8_,
                          ExpandVariablesInStringNew(std::__cxx11::string&,std::__cxx11::string&,bool,bool,bool,char_const*,long,bool,bool)
                          ::lineVar_abi_cxx11_._M_dataplus._M_p,local_3a0._8_8_), iVar8 != 0)))) {
          pcVar10 = GetDefinition(this,(string *)local_3a0);
        }
        else {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
          std::ostream::_M_insert<long>((long)local_1c8);
          std::__cxx11::stringbuf::str();
          std::__cxx11::string::operator=((string *)&local_2e8,(string *)local_378);
          if ((undefined1 *)local_378._0_8_ != local_378 + 0x10) {
            operator_delete((void *)local_378._0_8_,local_378._16_8_ + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
          std::ios_base::~ios_base(local_158);
LAB_0039d799:
          pcVar10 = (char *)0x0;
        }
      }
      else if (iVar8 == 1) {
        pcVar10 = cmsys::SystemTools::GetEnv((char *)local_3a0._0_8_);
      }
      else {
        if (iVar8 != 2) goto LAB_0039d799;
        pcVar10 = cmState::GetCacheEntryValue(local_270,(string *)local_3a0);
      }
      pSVar14 = pSStack_2e0;
      if (pcVar10 == (char *)0x0) {
        if (((!removeEmpty) && (this->GlobalGenerator->CMakeInstance->WarnUninitialized == true)) &&
           (bVar5 = cmState::Snapshot::IsInitialized(local_2b0,(string *)local_3a0), !bVar5)) {
          bVar5 = this->CheckSystemVars;
          bVar7 = true;
          if (bVar5 == false) {
            std::__cxx11::string::string((string *)&local_248,filename,&local_379);
            pcVar10 = cmake::GetHomeDirectory(this->GlobalGenerator->CMakeInstance);
            std::__cxx11::string::string((string *)&local_1e8,pcVar10,&local_37a);
            bVar6 = cmsys::SystemTools::IsSubDirectory(&local_248,&local_1e8);
            if (bVar6) goto LAB_0039d8fc;
            std::__cxx11::string::string((string *)&local_268,filename,&local_37b);
            pcVar10 = cmake::GetHomeOutputDirectory(this->GlobalGenerator->CMakeInstance);
            std::__cxx11::string::string((string *)&local_208,pcVar10,&local_37c);
            bVar7 = cmsys::SystemTools::IsSubDirectory(&local_268,&local_208);
            bVar6 = true;
          }
          else {
LAB_0039d8fc:
            bVar6 = false;
          }
          if (bVar6) {
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_208._M_dataplus._M_p != &local_208.field_2) {
              operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_268._M_dataplus._M_p != &local_268.field_2) {
              operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1
                             );
            }
          }
          if (bVar5 == false) {
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
              operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_248._M_dataplus._M_p != &local_248.field_2) {
              operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1
                             );
            }
          }
          if (bVar7 != false) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
            local_378._0_8_ = local_378 + 0x10;
            local_378._8_8_ = 0;
            local_378._16_8_ = local_378._16_8_ & 0xffffffffffffff00;
            local_358._M_p = (pointer)&local_348;
            local_350 = 0;
            local_348._M_local_buf[0] = '\0';
            local_338 = 0;
            cmOutputConverter::cmOutputConverter(&local_50,*local_2b0);
            std::__cxx11::string::string((string *)&local_228,filename,&local_37d);
            cmOutputConverter::Convert(&local_298,&local_50,&local_228,HOME,UNCHANGED);
            std::__cxx11::string::operator=((string *)&local_358,(string *)&local_298);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_298._M_dataplus._M_p != &local_298.field_2) {
              operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_228._M_dataplus._M_p != &local_228.field_2) {
              operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1
                             );
            }
            local_338 = local_2c0;
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1c8,"uninitialized variable \'",0x18);
            poVar18 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1c8,(char *)local_3a0._0_8_,local_3a0._8_8_);
            std::__ostream_insert<char,std::char_traits<char>>(poVar18,"\'",1);
            this_00 = this->GlobalGenerator->CMakeInstance;
            std::__cxx11::stringbuf::str();
            cmake::IssueMessage(this_00,AUTHOR_WARNING,&local_298,(cmListFileContext *)local_378,
                                false);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_298._M_dataplus._M_p != &local_298.field_2) {
              operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1
                             );
            }
            cmListFileContext::~cmListFileContext((cmListFileContext *)local_378);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
            std::ios_base::~ios_base(local_158);
          }
        }
      }
      else if ((char)local_2c4 == '\0') {
        strlen(pcVar10);
        std::__cxx11::string::_M_replace((ulong)&local_2e8,0,(char *)pSVar14,(ulong)pcVar10);
      }
      else {
        local_378._0_8_ = local_378 + 0x10;
        sVar17 = strlen(pcVar10);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_378,pcVar10,pcVar10 + sVar17);
        cmSystemTools::EscapeQuotes((string *)local_1c8,(string *)local_378);
        std::__cxx11::string::operator=((string *)&local_2e8,(string *)local_1c8);
        if ((Snapshot *)local_1c8._0_8_ != local_1b8) {
          operator_delete((void *)local_1c8._0_8_,(ulong)((long)local_1b8[0].State + 1));
        }
        if ((undefined1 *)local_378._0_8_ != local_378 + 0x10) {
          operator_delete((void *)local_378._0_8_,local_378._16_8_ + 1);
        }
      }
      std::__cxx11::string::replace
                ((ulong)&local_328,uVar3,(char *)((long)local_320 - uVar3),(ulong)local_2e8);
      if (local_2e8 != &local_2d8) {
        operator_delete(local_2e8,CONCAT71(uStack_2d7,local_2d8) + 1);
      }
      iVar11._M_current = (t_lookup *)(local_3a0 + 0x10);
      if ((t_lookup *)local_3a0._0_8_ != iVar11._M_current) {
        operator_delete((void *)local_3a0._0_8_,local_3a0._16_8_ + 1);
        iVar11._M_current = (t_lookup *)extraout_RAX_00;
      }
      pSVar16 = (Snapshot *)((long)&pSVar20->State + 1);
    }
LAB_0039dc3b:
    if (((ulong)local_330 & 1) != 0) goto LAB_0039e004;
  } while ((((ulong)local_2a0 & 1) == 0) &&
          (ppcVar4 = &pSVar20->State, pSVar20 = (Snapshot *)((long)&pSVar20->State + 1),
          pSVar14 = pSVar16, *(char *)((long)ppcVar4 + 1) != '\0'));
  if (local_308 != (Snapshot *)iStack_300._M_current) {
    local_330 = (Snapshot *)CONCAT71((int7)((ulong)local_308 >> 8),1);
    std::__cxx11::string::append((char *)errorstr);
  }
LAB_0039e004:
  if (((ulong)local_330 & 1) == 0) {
    std::__cxx11::string::append((char *)&local_328);
    std::__cxx11::string::_M_assign((string *)local_2a8);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1c8,"Syntax error in cmake code ",0x1b);
    if (filename != (char *)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"at\n",3);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"  ",2);
      sVar17 = strlen(filename);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,filename,sVar17);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,":",1);
      poVar18 = std::ostream::_M_insert<long>((long)local_1c8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar18,"\n",1);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1c8,"when parsing string\n",0x14);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"  ",2);
    poVar18 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1c8,(local_2a8->_M_dataplus)._M_p,
                         local_2a8->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar18,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1c8,(errorstr->_M_dataplus)._M_p,errorstr->_M_string_length);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=((string *)errorstr,(string *)local_378);
    if ((undefined1 *)local_378._0_8_ != local_378 + 0x10) {
      operator_delete((void *)local_378._0_8_,local_378._16_8_ + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
    std::ios_base::~ios_base(local_158);
    local_3ac = FATAL_ERROR;
  }
  if (local_308 != (Snapshot *)0x0) {
    operator_delete(local_308,(long)local_2f8 - (long)local_308);
  }
  if (local_328 != &local_318) {
    operator_delete(local_328,CONCAT71(uStack_317,local_318) + 1);
  }
  return local_3ac;
}

Assistant:

cmake::MessageType cmMakefile::ExpandVariablesInStringNew(
                                            std::string& errorstr,
                                            std::string& source,
                                            bool escapeQuotes,
                                            bool noEscapes,
                                            bool atOnly,
                                            const char* filename,
                                            long line,
                                            bool removeEmpty,
                                            bool replaceAt) const
{
  // This method replaces ${VAR} and @VAR@ where VAR is looked up
  // with GetDefinition(), if not found in the map, nothing is expanded.
  // It also supports the $ENV{VAR} syntax where VAR is looked up in
  // the current environment variables.

  const char* in = source.c_str();
  const char* last = in;
  std::string result;
  result.reserve(source.size());
  std::vector<t_lookup> openstack;
  bool error = false;
  bool done = false;
  cmake::MessageType mtype = cmake::LOG;

  cmState* state = this->GetCMakeInstance()->GetState();

  do
    {
    char inc = *in;
    switch(inc)
      {
      case '}':
        if(!openstack.empty())
          {
          t_lookup var = openstack.back();
          openstack.pop_back();
          result.append(last, in - last);
          std::string const& lookup = result.substr(var.loc);
          const char* value = NULL;
          std::string varresult;
          static const std::string lineVar = "CMAKE_CURRENT_LIST_LINE";
          switch(var.domain)
            {
            case NORMAL:
              if(filename && lookup == lineVar)
                {
                std::ostringstream ostr;
                ostr << line;
                varresult = ostr.str();
                }
              else
                {
                value = this->GetDefinition(lookup);
                }
              break;
            case ENVIRONMENT:
              value = cmSystemTools::GetEnv(lookup.c_str());
              break;
            case CACHE:
              value = state->GetCacheEntryValue(lookup);
              break;
            }
          // Get the string we're meant to append to.
          if(value)
            {
            if(escapeQuotes)
              {
              varresult = cmSystemTools::EscapeQuotes(value);
              }
            else
              {
              varresult = value;
              }
            }
          else if(!removeEmpty)
            {
            // check to see if we need to print a warning
            // if strict mode is on and the variable has
            // not been "cleared"/initialized with a set(foo ) call
            if(this->GetCMakeInstance()->GetWarnUninitialized() &&
               !this->VariableInitialized(lookup))
              {
              if (this->CheckSystemVars ||
                  cmSystemTools::IsSubDirectory(filename,
                                                this->GetHomeDirectory()) ||
                  cmSystemTools::IsSubDirectory(filename,
                                             this->GetHomeOutputDirectory()))
                {
                std::ostringstream msg;
                cmListFileContext lfc;
                cmOutputConverter converter(this->StateSnapshot);
                lfc.FilePath =
                    converter.Convert(filename, cmOutputConverter::HOME);
                lfc.Line = line;
                msg << "uninitialized variable \'" << lookup << "\'";
                this->GetCMakeInstance()->IssueMessage(cmake::AUTHOR_WARNING,
                                                       msg.str(), lfc);
                }
              }
            }
          result.replace(var.loc, result.size() - var.loc, varresult);
          // Start looking from here on out.
          last = in + 1;
          }
        break;
      case '$':
        if(!atOnly)
          {
          t_lookup lookup;
          const char* next = in + 1;
          const char* start = NULL;
          char nextc = *next;
          if(nextc == '{')
            {
            // Looking for a variable.
            start = in + 2;
            lookup.domain = NORMAL;
            }
          else if(nextc == '<')
            {
            }
          else if(!nextc)
            {
            result.append(last, next - last);
            last = next;
            }
          else if(cmHasLiteralPrefix(next, "ENV{"))
            {
            // Looking for an environment variable.
            start = in + 5;
            lookup.domain = ENVIRONMENT;
            }
          else if(cmHasLiteralPrefix(next, "CACHE{"))
            {
            // Looking for a cache variable.
            start = in + 7;
            lookup.domain = CACHE;
            }
          else
            {
            if(this->cmNamedCurly.find(next))
              {
              errorstr = "Syntax $"
                  + std::string(next, this->cmNamedCurly.end())
                  + "{} is not supported.  Only ${}, $ENV{}, "
                    "and $CACHE{} are allowed.";
              mtype = cmake::FATAL_ERROR;
              error = true;
              }
            }
          if(start)
            {
            result.append(last, in - last);
            last = start;
            in = start - 1;
            lookup.loc = result.size();
            openstack.push_back(lookup);
            }
          break;
          }
      case '\\':
        if(!noEscapes)
          {
          const char* next = in + 1;
          char nextc = *next;
          if(nextc == 't')
            {
            result.append(last, in - last);
            result.append("\t");
            last = next + 1;
            }
          else if(nextc == 'n')
            {
            result.append(last, in - last);
            result.append("\n");
            last = next + 1;
            }
          else if(nextc == 'r')
            {
            result.append(last, in - last);
            result.append("\r");
            last = next + 1;
            }
          else if(nextc == ';' && openstack.empty())
            {
            // Handled in ExpandListArgument; pass the backslash literally.
            }
          else if (isalnum(nextc) || nextc == '\0')
            {
            errorstr += "Invalid character escape '\\";
            if (nextc)
              {
              errorstr += nextc;
              errorstr += "'.";
              }
            else
              {
              errorstr += "' (at end of input).";
              }
            error = true;
            }
          else
            {
            // Take what we've found so far, skipping the escape character.
            result.append(last, in - last);
            // Start tracking from the next character.
            last = in + 1;
            }
          // Skip the next character since it was escaped, but don't read past
          // the end of the string.
          if(*last)
            {
            ++in;
            }
          }
        break;
      case '\n':
        // Onto the next line.
        ++line;
        break;
      case '\0':
        done = true;
        break;
      case '@':
        if(replaceAt)
          {
          const char* nextAt = strchr(in + 1, '@');
          if(nextAt && nextAt != in + 1 &&
             nextAt == in + 1 + strspn(in + 1,
                "ABCDEFGHIJKLMNOPQRSTUVWXYZ"
                "abcdefghijklmnopqrstuvwxyz"
                "0123456789/_.+-"))
            {
            std::string variable(in + 1, nextAt - in - 1);
            std::string varresult = this->GetSafeDefinition(variable);
            if(escapeQuotes)
              {
              varresult = cmSystemTools::EscapeQuotes(varresult);
              }
            // Skip over the variable.
            result.append(last, in - last);
            result.append(varresult);
            in = nextAt;
            last = in + 1;
            break;
            }
          }
        // Failed to find a valid @ expansion; treat it as literal.
        /* FALLTHROUGH */
      default:
        {
        if(!openstack.empty() &&
           !(isalnum(inc) || inc == '_' ||
             inc == '/' || inc == '.' ||
             inc == '+' || inc == '-'))
          {
          errorstr += "Invalid character (\'";
          errorstr += inc;
          result.append(last, in - last);
          errorstr += "\') in a variable name: "
                      "'" + result.substr(openstack.back().loc) + "'";
          mtype = cmake::FATAL_ERROR;
          error = true;
          }
        break;
        }
      }
    // Look at the next character.
    } while(!error && !done && *++in);

  // Check for open variable references yet.
  if(!error && !openstack.empty())
    {
    // There's an open variable reference waiting.  Policy CMP0010 flags
    // whether this is an error or not.  The new parser now enforces
    // CMP0010 as well.
    errorstr += "There is an unterminated variable reference.";
    error = true;
    }

  if(error)
    {
    std::ostringstream emsg;
    emsg << "Syntax error in cmake code ";
    if(filename)
      {
      // This filename and line number may be more specific than the
      // command context because one command invocation can have
      // arguments on multiple lines.
      emsg << "at\n"
            << "  " << filename << ":" << line << "\n";
      }
    emsg << "when parsing string\n"
         << "  " << source << "\n";
    emsg << errorstr;
    mtype = cmake::FATAL_ERROR;
    errorstr = emsg.str();
    }
  else
    {
    // Append the rest of the unchanged part of the string.
    result.append(last);

    source = result;
    }

  return mtype;
}